

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execShiftRg<(moira::Instr)69,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint cnt;
  
  cnt = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) & 0x3f;
  prefetch<4ul>(this);
  (*this->_vptr_Moira[0x19])(this,(ulong)(cnt * 2 + 2));
  uVar1 = shift<(moira::Instr)69,(moira::Size)2>
                    (this,cnt,(ulong)*(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58)
                    );
  *(short *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (short)uVar1;
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = readD(src) & 0x3F;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}